

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O2

void __thiscall
DIS::AcousticEmitterSystemData::unmarshal(AcousticEmitterSystemData *this,DataStream *dataStream)

{
  ulong uVar1;
  AcousticBeamData x;
  AcousticBeamData AStack_58;
  
  DataStream::operator>>(dataStream,&this->_emitterSystemDataLength);
  DataStream::operator>>(dataStream,&this->_numberOfBeams);
  DataStream::operator>>(dataStream,&this->_pad2);
  AcousticEmitterSystem::unmarshal(&this->_acousticEmitterSystem,dataStream);
  Vector3Float::unmarshal(&this->_emitterLocation,dataStream);
  std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::clear
            (&this->_beamRecords);
  for (uVar1 = 0; uVar1 < this->_numberOfBeams; uVar1 = uVar1 + 1) {
    AcousticBeamData::AcousticBeamData(&AStack_58);
    AcousticBeamData::unmarshal(&AStack_58,dataStream);
    std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::push_back
              (&this->_beamRecords,&AStack_58);
    AcousticBeamData::~AcousticBeamData(&AStack_58);
  }
  return;
}

Assistant:

void AcousticEmitterSystemData::unmarshal(DataStream& dataStream)
{
    dataStream >> _emitterSystemDataLength;
    dataStream >> _numberOfBeams;
    dataStream >> _pad2;
    _acousticEmitterSystem.unmarshal(dataStream);
    _emitterLocation.unmarshal(dataStream);

     _beamRecords.clear();
     for(size_t idx = 0; idx < _numberOfBeams; idx++)
     {
        AcousticBeamData x;
        x.unmarshal(dataStream);
        _beamRecords.push_back(x);
     }
}